

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O3

snd_pcm_uframes_t get_buffer_size(void)

{
  uint uVar1;
  undefined8 uVar2;
  char *__nptr;
  snd_pcm_uframes_t sVar3;
  
  uVar2 = al_get_system_config();
  __nptr = (char *)al_get_config_value(uVar2,"alsa","buffer_size2");
  sVar3 = 0x800;
  if ((__nptr != (char *)0x0) && (*__nptr != '\0')) {
    uVar1 = atoi(__nptr);
    sVar3 = 1;
    if (1 < (int)uVar1) {
      sVar3 = (snd_pcm_uframes_t)uVar1;
    }
  }
  return sVar3;
}

Assistant:

static snd_pcm_uframes_t get_buffer_size(void)
{
   const char *val = al_get_config_value(al_get_system_config(),
      "alsa", "buffer_size2");
   if (val && val[0] != '\0') {
      int n = atoi(val);
      if (n < 1)
         n = 1;
      return n;
   }

   return DEFAULT_BUFFER_SIZE;
}